

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

void cleanup_projection(void)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < z_info->projection_max; uVar2 = uVar2 + 1) {
    string_free(*(char **)((long)&projections->name + lVar1));
    string_free(*(char **)((long)&projections->type + lVar1));
    string_free(*(char **)((long)&projections->desc + lVar1));
    string_free(*(char **)((long)&projections->lash_desc + lVar1));
    string_free(*(char **)((long)&projections->player_desc + lVar1));
    string_free(*(char **)((long)&projections->blind_desc + lVar1));
    lVar1 = lVar1 + 0x70;
  }
  mem_free(projections);
  return;
}

Assistant:

static void cleanup_projection(void)
{
	int idx;
	for (idx = 0; idx < z_info->projection_max; idx++) {
		string_free(projections[idx].name);
		string_free(projections[idx].type);
		string_free(projections[idx].desc);
		string_free(projections[idx].lash_desc);
		string_free(projections[idx].player_desc);
		string_free(projections[idx].blind_desc);
	}
	mem_free(projections);
}